

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
TempChatBanGameCommand::trigger
          (TempChatBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  PlayerInfo *pPVar4;
  char *pcVar5;
  undefined8 uVar6;
  seconds sVar7;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *in_R9;
  long lVar8;
  char *pcVar9;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar10;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_b8;
  long local_90;
  char *pcStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab6f;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_b8,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  sVar7 = pluginInstance.m_defaultTempBanTime;
  lVar8 = CONCAT44(local_b8.first._M_len._4_4_,(undefined4)local_b8.first._M_len);
  if (lVar8 == 0) {
    pcVar5 = "Error: Too few parameters. Syntax: tchatban [Duration] <player> [Reason]";
    uVar6 = 0x48;
    goto LAB_0013283e;
  }
  pcVar5 = (char *)CONCAT44(local_b8.first._M_str._4_4_,local_b8.first._M_str._0_4_);
  lVar1 = CONCAT44(local_b8.second._M_len._4_4_,(undefined4)local_b8.second._M_len);
  pcVar9 = (char *)CONCAT44(local_b8.second._M_str._4_4_,local_b8.second._M_str._0_4_);
  pPVar4 = (PlayerInfo *)RenX::Server::getPlayerByPartName(source,lVar8,pcVar5);
  if (pPVar4 == (PlayerInfo *)0x0) {
    if (CONCAT44(local_b8.second._M_len._4_4_,(undefined4)local_b8.second._M_len) != 0) {
      dVar10 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                         (pcVar5,pcVar5 + lVar8);
      sVar7.__r = (rep)dVar10.duration.__r;
      if (0 < sVar7.__r) {
        if (pluginInstance.m_maxTempBanTime.__r < sVar7.__r) {
          sVar7 = pluginInstance.m_maxTempBanTime;
        }
        args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab6f;
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_80,
                   (jessilib *)CONCAT44(local_b8.second._M_str._4_4_,local_b8.second._M_str._0_4_),
                   (char *)((jessilib *)
                            CONCAT44(local_b8.second._M_str._4_4_,local_b8.second._M_str._0_4_) +
                           CONCAT44(local_b8.second._M_len._4_4_,(undefined4)local_b8.second._M_len)
                           )," \t","",in_R9);
        local_b8.first._M_len._0_4_ = local_80._M_dataplus._M_p._0_4_;
        local_b8.first._M_len._4_4_ = local_80._M_dataplus._M_p._4_4_;
        local_b8.first._M_str._0_4_ = (undefined4)local_80._M_string_length;
        local_b8.first._M_str._4_4_ = local_80._M_string_length._4_4_;
        local_b8.second._M_len._0_4_ = local_80.field_2._M_allocated_capacity._0_4_;
        local_b8.second._M_len._4_4_ = local_80.field_2._M_allocated_capacity._4_4_;
        local_b8.second._M_str._0_4_ = local_80.field_2._8_4_;
        local_b8.second._M_str._4_4_ = local_80.field_2._12_4_;
        lVar1 = CONCAT44(local_80.field_2._M_allocated_capacity._4_4_,
                         local_80.field_2._M_allocated_capacity._0_4_);
        pcVar9 = "No reason";
        if (lVar1 != 0) {
          pcVar9 = (char *)CONCAT44(local_80.field_2._12_4_,local_80.field_2._8_4_);
        }
        lVar8 = 9;
        if (lVar1 != 0) {
          lVar8 = lVar1;
        }
        pPVar4 = (PlayerInfo *)
                 RenX::Server::getPlayerByPartName
                           (source,CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                            local_80._M_dataplus._M_p._0_4_),
                            CONCAT44(local_80._M_string_length._4_4_,
                                     (undefined4)local_80._M_string_length));
        if (pPVar4 != (PlayerInfo *)0x0) goto LAB_001326cc;
      }
    }
    pcVar5 = "Error: Player not found.";
    uVar6 = 0x18;
  }
  else {
    if (lVar1 == 0) {
      pcVar9 = "No reason";
    }
    lVar8 = 9;
    if (lVar1 != 0) {
      lVar8 = lVar1;
    }
LAB_001326cc:
    if (pPVar4 == player) {
      pcVar5 = "Error: You can not ban yourself.";
      uVar6 = 0x20;
    }
    else {
      if (player->access <= pPVar4->access) {
        local_40 = 0x24;
        local_38 = "Error: You can not ban higher level ";
        local_50._M_len = pluginInstance.m_staffTitle._M_string_length;
        local_50._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
        local_60._M_len = 2;
        local_60._M_str = "s.";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_80,(jessilib *)&local_40,&local_50,&local_60,args_2);
        RenX::Server::sendMessage
                  (source,player,
                   CONCAT44(local_80._M_string_length._4_4_,(undefined4)local_80._M_string_length),
                   CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) ==
            &local_80.field_2) {
          return;
        }
        operator_delete((undefined1 *)
                        CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_),
                        CONCAT44(local_80.field_2._M_allocated_capacity._4_4_,
                                 local_80.field_2._M_allocated_capacity._0_4_) + 1);
        return;
      }
      RenX::Server::mute((PlayerInfo *)source);
      local_90._0_4_ = (undefined4)lVar8;
      pcStack_88._0_4_ = SUB84(pcVar9,0);
      uVar2 = (undefined4)local_90;
      local_90 = lVar8;
      uVar3 = pcStack_88._0_4_;
      pcStack_88 = pcVar9;
      RenX::BanDatabase::add
                (RenX::banDatabase,source,pPVar4,(player->name)._M_string_length,
                 (player->name)._M_dataplus._M_p,sVar7.__r,uVar2,uVar3,0x40);
      pcVar5 = "Player has been temporarily muted and chat banned from the game.";
      uVar6 = 0x40;
    }
  }
LAB_0013283e:
  RenX::Server::sendMessage(source,player,uVar6,pcVar5);
  return;
}

Assistant:

void TempChatBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view name = split_parameters.first;
		std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
		std::string_view reason = split_parameters.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target == nullptr
			&& !split_parameters.second.empty()) {
			// Try reading first token as duration
			duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
			if (duration.count() > 0) {
				duration = std::min(duration, pluginInstance.getMaxTBanTime());
				split_parameters = jessilib::word_split_once_view(split_parameters.second, WHITESPACE_SV);
				name = split_parameters.first;
				reason = split_parameters.second;
				target = source->getPlayerByPartName(name);
			}
		}

		if (reason.empty()) {
			reason = "No reason"sv;
		}

		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You can not ban yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else {
			source->mute(*target);
			RenX::banDatabase->add(source, *target, player->name, reason, duration, RenX::BanDatabase::Entry::FLAG_TYPE_CHAT);
			source->sendMessage(*player, "Player has been temporarily muted and chat banned from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: tchatban [Duration] <player> [Reason]"sv);
}